

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heapmap.cpp
# Opt level: O1

void test4(void)

{
  bool bVar1;
  HeapMap<LinkedNode,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
  *this;
  LinkedNode *k;
  LinkedNode *val;
  __node_base *p_Var2;
  ostream *poVar3;
  void *local_40;
  int local_38;
  int local_34;
  
  this = TinyGC::
         MakeGarbageCollected<HeapMap<LinkedNode,LinkedNode,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>
                   (tg);
  local_34 = 0;
  do {
    local_40 = (void *)0x0;
    k = TinyGC::MakeGarbageCollected<LinkedNode,decltype(nullptr),int&>(tg,&local_40,&local_34);
    local_40 = (void *)0x0;
    local_38 = local_34 + 100;
    val = TinyGC::MakeGarbageCollected<LinkedNode,decltype(nullptr),int>(tg,&local_40,&local_38);
    HeapMap<LinkedNode,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
    ::insert(this,k,val);
    p_Var2 = &(this->map_)._M_h._M_before_begin;
    do {
      p_Var2 = p_Var2->_M_nxt;
      if (p_Var2 == (__node_base *)0x0) break;
    } while ((LinkedNode *)(p_Var2[1]._M_nxt)->_M_nxt != k);
    poVar3 = std::ostream::_M_insert<void_const*>(&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    bVar1 = 8 < local_34;
    local_34 = local_34 + 1;
    if (bVar1) {
      return;
    }
  } while( true );
}

Assistant:

void test4() {
  HeapMap<LinkedNode, LinkedNode> *p =
      MakeGarbageCollected<HeapMap<LinkedNode, LinkedNode>>();
  for (int id = 0; id < 10; id++) {
    auto t1 = MakeGarbageCollected<LinkedNode>(nullptr, id);
    auto t2 = MakeGarbageCollected<LinkedNode>(nullptr, id + 100);

    p->insert(t1, t2);
    // p->erase(t1);
    std::cout << p->at(t1) << std::endl;
  }
}